

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

Statement * __thiscall
slang::ast::StatementBlockSymbol::getStatement
          (StatementBlockSymbol *this,ASTContext *parentContext,StatementContext *stmtCtx)

{
  SyntaxNode *syntax;
  Scope *pSVar1;
  pointer ppSVar2;
  size_type sVar3;
  size_type sVar4;
  Statement *pSVar5;
  ASTContext context;
  ASTContext local_58;
  
  pSVar5 = this->stmt;
  if (pSVar5 == (Statement *)0x0) {
    if ((this->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&this->super_Scope);
      if (this->stmt != (Statement *)0x0) {
        return this->stmt;
      }
    }
    syntax = (this->super_Symbol).originatingSyntax;
    if ((syntax == (SyntaxNode *)0x0) || (syntax->kind == RsRule)) {
      pSVar1 = (parentContext->scope).ptr;
      if (pSVar1 == (Scope *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                  );
      }
      pSVar5 = BlockStatement::makeEmpty(pSVar1->compilation);
      this->stmt = pSVar5;
    }
    else {
      local_58.flags.m_bits = (parentContext->flags).m_bits;
      local_58.instanceOrProc = parentContext->instanceOrProc;
      local_58.firstTempVar = parentContext->firstTempVar;
      local_58.randomizeDetails = parentContext->randomizeDetails;
      local_58.assertionInstance = parentContext->assertionInstance;
      local_58._12_4_ = SUB84((ulong)*(undefined8 *)&parentContext->lookupIndex >> 0x20,0);
      local_58.lookupIndex = 0xffffffff;
      ppSVar2 = (stmtCtx->blocks).data_;
      sVar3 = (stmtCtx->blocks).size_;
      sVar4 = (this->blocks).size_;
      (stmtCtx->blocks).data_ = (this->blocks).data_;
      (stmtCtx->blocks).size_ = sVar4;
      local_58.scope.ptr = &this->super_Scope;
      pSVar5 = Statement::bindBlock(this,syntax,&local_58,stmtCtx);
      this->stmt = pSVar5;
      (stmtCtx->blocks).data_ = ppSVar2;
      (stmtCtx->blocks).size_ = sVar3;
      pSVar5 = this->stmt;
    }
  }
  return pSVar5;
}

Assistant:

const Statement& StatementBlockSymbol::getStatement(const ASTContext& parentContext,
                                                    Statement::StatementContext& stmtCtx) const {
    if (!stmt) {
        ensureElaborated();
        if (stmt)
            return *stmt;

        auto syntax = getSyntax();
        if (!syntax || syntax->kind == SyntaxKind::RsRule) {
            stmt = &BlockStatement::makeEmpty(parentContext.getCompilation());
        }
        else {
            ASTContext context = parentContext;
            context.scope = this;
            context.lookupIndex = SymbolIndex(UINT32_MAX);

            auto oldBlocks = std::exchange(stmtCtx.blocks, blocks);
            auto guard = ScopeGuard([&] { stmtCtx.blocks = oldBlocks; });

            stmt = &Statement::bindBlock(*this, *syntax, context, stmtCtx);
        }
    }
    return *stmt;
}